

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveUpdateRight(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *vec,int *ridx,int n,
                   number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *eps)

{
  int iVar1;
  int iVar2;
  int iVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  pointer pnVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  bool bVar11;
  type_conflict5 tVar12;
  type_conflict5 tVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  cpp_dec_float<200U,_int,_void> *pcVar19;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  cpp_dec_float<200U,_int,_void> *pcVar21;
  int *piVar22;
  long lVar23;
  byte bVar24;
  cpp_dec_float<200U,_int,_void> *local_390;
  cpp_dec_float<200U,_int,_void> local_338;
  cpp_dec_float<200U,_int,_void> local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar24 = 0;
  local_2b8.fpclass = cpp_dec_float_finite;
  local_2b8.prec_elem = 0x1c;
  local_2b8.data._M_elems[0] = 0;
  local_2b8.data._M_elems[1] = 0;
  local_2b8.data._M_elems[2] = 0;
  local_2b8.data._M_elems[3] = 0;
  local_2b8.data._M_elems[4] = 0;
  local_2b8.data._M_elems[5] = 0;
  local_2b8.data._M_elems[6] = 0;
  local_2b8.data._M_elems[7] = 0;
  local_2b8.data._M_elems[8] = 0;
  local_2b8.data._M_elems[9] = 0;
  local_2b8.data._M_elems[10] = 0;
  local_2b8.data._M_elems[0xb] = 0;
  local_2b8.data._M_elems[0xc] = 0;
  local_2b8.data._M_elems[0xd] = 0;
  local_2b8.data._M_elems[0xe] = 0;
  local_2b8.data._M_elems[0xf] = 0;
  local_2b8.data._M_elems[0x10] = 0;
  local_2b8.data._M_elems[0x11] = 0;
  local_2b8.data._M_elems[0x12] = 0;
  local_2b8.data._M_elems[0x13] = 0;
  local_2b8.data._M_elems[0x14] = 0;
  local_2b8.data._M_elems[0x15] = 0;
  local_2b8.data._M_elems[0x16] = 0;
  local_2b8.data._M_elems[0x17] = 0;
  local_2b8.data._M_elems[0x18] = 0;
  local_2b8.data._M_elems[0x19] = 0;
  local_2b8.data._M_elems._104_5_ = 0;
  local_2b8.data._M_elems[0x1b]._1_3_ = 0;
  local_2b8.exp = 0;
  local_2b8.neg = false;
  pnVar6 = (this->l).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar7 = (this->l).idx;
  piVar8 = (this->l).row;
  piVar9 = (this->l).start;
  iVar1 = (this->l).firstUnused;
  for (lVar23 = (long)(this->l).firstUpdate; lVar23 < iVar1; lVar23 = lVar23 + 1) {
    iVar2 = piVar8[lVar23];
    lVar16 = 0x1c;
    pnVar17 = vec + iVar2;
    pcVar20 = &local_1b0;
    for (lVar15 = lVar16; lVar15 != 0; lVar15 = lVar15 + -1) {
      (pcVar20->data)._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar17 + ((ulong)bVar24 * -2 + 1) * 4);
      pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + ((ulong)bVar24 * -2 + 1) * 4);
    }
    local_1b0.exp = vec[iVar2].m_backend.exp;
    local_1b0.neg = vec[iVar2].m_backend.neg;
    local_1b0.fpclass = vec[iVar2].m_backend.fpclass;
    local_1b0.prec_elem = vec[iVar2].m_backend.prec_elem;
    pnVar17 = vec + iVar2;
    pnVar18 = &local_130;
    for (lVar15 = lVar16; lVar15 != 0; lVar15 = lVar15 + -1) {
      (pnVar18->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar17 + ((ulong)bVar24 * -2 + 1) * 4);
      pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar18 + ((ulong)bVar24 * -2 + 1) * 4);
    }
    pnVar17 = eps;
    pnVar18 = &local_b0;
    for (; lVar16 != 0; lVar16 = lVar16 + -1) {
      (pnVar18->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar17 + ((ulong)bVar24 * -2 + 1) * 4);
      pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar18 + ((ulong)bVar24 * -2 + 1) * 4);
    }
    local_b0.m_backend.exp = (eps->m_backend).exp;
    local_b0.m_backend.neg = (eps->m_backend).neg;
    local_b0.m_backend.fpclass = (eps->m_backend).fpclass;
    local_b0.m_backend.prec_elem = (eps->m_backend).prec_elem;
    local_130.m_backend.exp = local_1b0.exp;
    local_130.m_backend.neg = local_1b0.neg;
    local_130.m_backend.fpclass = local_1b0.fpclass;
    local_130.m_backend.prec_elem = local_1b0.prec_elem;
    bVar11 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_130,&local_b0);
    if (bVar11) {
      iVar2 = piVar9[lVar23];
      piVar22 = piVar7 + iVar2;
      local_390 = &pnVar6[iVar2].m_backend;
      for (iVar14 = piVar9[lVar23 + 1]; lVar16 = 0x1c, iVar2 < iVar14; iVar14 = iVar14 + -1) {
        iVar3 = *piVar22;
        ridx[n] = iVar3;
        pnVar17 = vec + iVar3;
        pcVar20 = &local_2b8;
        pnVar18 = pnVar17;
        pcVar19 = pcVar20;
        for (; lVar16 != 0; lVar16 = lVar16 + -1) {
          (pcVar19->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + ((ulong)bVar24 * -2 + 1) * 4);
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar24 * -8 + 4);
        }
        local_2b8.exp = vec[iVar3].m_backend.exp;
        local_2b8.neg = vec[iVar3].m_backend.neg;
        local_2b8.fpclass = vec[iVar3].m_backend.fpclass;
        local_2b8.prec_elem = vec[iVar3].m_backend.prec_elem;
        local_338.data._M_elems._0_8_ = local_338.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar12 = boost::multiprecision::operator==
                           ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)pcVar20,(int *)&local_338);
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 0x1c;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems[6] = 0;
        result.m_backend.data._M_elems[7] = 0;
        result.m_backend.data._M_elems[8] = 0;
        result.m_backend.data._M_elems[9] = 0;
        result.m_backend.data._M_elems[10] = 0;
        result.m_backend.data._M_elems[0xb] = 0;
        result.m_backend.data._M_elems[0xc] = 0;
        result.m_backend.data._M_elems[0xd] = 0;
        result.m_backend.data._M_elems[0xe] = 0;
        result.m_backend.data._M_elems[0xf] = 0;
        result.m_backend.data._M_elems[0x10] = 0;
        result.m_backend.data._M_elems[0x11] = 0;
        result.m_backend.data._M_elems[0x12] = 0;
        result.m_backend.data._M_elems[0x13] = 0;
        result.m_backend.data._M_elems[0x14] = 0;
        result.m_backend.data._M_elems[0x15] = 0;
        result.m_backend.data._M_elems[0x16] = 0;
        result.m_backend.data._M_elems[0x17] = 0;
        result.m_backend.data._M_elems[0x18] = 0;
        result.m_backend.data._M_elems[0x19] = 0;
        result.m_backend.data._M_elems._104_5_ = 0;
        result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result.m_backend,&local_1b0,local_390);
        local_338.fpclass = cpp_dec_float_finite;
        local_338.prec_elem = 0x1c;
        local_338.data._M_elems[0] = 0;
        local_338.data._M_elems[1] = 0;
        local_338.data._M_elems[2] = 0;
        local_338.data._M_elems[3] = 0;
        local_338.data._M_elems[4] = 0;
        local_338.data._M_elems[5] = 0;
        local_338.data._M_elems[6] = 0;
        local_338.data._M_elems[7] = 0;
        local_338.data._M_elems[8] = 0;
        local_338.data._M_elems[9] = 0;
        local_338.data._M_elems[10] = 0;
        local_338.data._M_elems[0xb] = 0;
        local_338.data._M_elems[0xc] = 0;
        local_338.data._M_elems[0xd] = 0;
        local_338.data._M_elems[0xe] = 0;
        local_338.data._M_elems[0xf] = 0;
        local_338.data._M_elems[0x10] = 0;
        local_338.data._M_elems[0x11] = 0;
        local_338.data._M_elems[0x12] = 0;
        local_338.data._M_elems[0x13] = 0;
        local_338.data._M_elems[0x14] = 0;
        local_338.data._M_elems[0x15] = 0;
        local_338.data._M_elems[0x16] = 0;
        local_338.data._M_elems[0x17] = 0;
        local_338.data._M_elems[0x18] = 0;
        local_338.data._M_elems[0x19] = 0;
        local_338.data._M_elems._104_5_ = 0;
        local_338.data._M_elems[0x1b]._1_3_ = 0;
        local_338.exp = 0;
        local_338.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_338,pcVar20,&result.m_backend);
        lVar16 = 0x1c;
        pcVar19 = &local_338;
        pcVar21 = pcVar20;
        for (lVar15 = lVar16; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pcVar21->data)._M_elems[0] = (pcVar19->data)._M_elems[0];
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar24 * -8 + 4);
          pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar24 * -8 + 4);
        }
        local_2b8.exp = local_338.exp;
        local_2b8.neg = local_338.neg;
        local_2b8.fpclass = local_338.fpclass;
        local_2b8.prec_elem = local_338.prec_elem;
        result.m_backend.data._M_elems._0_8_ =
             result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar13 = boost::multiprecision::operator!=
                           ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)pcVar20,(int *)&result.m_backend);
        lVar15 = lVar16;
        pcVar19 = &local_338;
        if (tVar13) {
          for (; lVar15 != 0; lVar15 = lVar15 + -1) {
            (pcVar19->data)._M_elems[0] = (pcVar20->data)._M_elems[0];
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar24 * -8 + 4);
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar24 * -8 + 4);
          }
          pcVar20 = &local_2b8;
          pcVar19 = &local_2b8;
          pcVar21 = &local_2b8;
          pcVar10 = &local_2b8;
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (&local_338,1e-100,(type *)0x0);
          pcVar20 = &local_338;
          pcVar19 = &local_338;
          pcVar21 = &local_338;
          pcVar10 = &local_338;
        }
        piVar22 = piVar22 + 1;
        n = n + (uint)tVar12;
        local_390 = local_390 + 1;
        iVar3 = pcVar20->exp;
        bVar11 = pcVar19->neg;
        fVar4 = pcVar21->fpclass;
        iVar5 = pcVar10->prec_elem;
        pcVar20 = &local_338;
        pnVar18 = pnVar17;
        for (; lVar16 != 0; lVar16 = lVar16 + -1) {
          (pnVar18->m_backend).data._M_elems[0] = (pcVar20->data)._M_elems[0];
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar24 * -8 + 4);
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + ((ulong)bVar24 * -2 + 1) * 4);
        }
        (pnVar17->m_backend).exp = iVar3;
        (pnVar17->m_backend).neg = bVar11;
        (pnVar17->m_backend).fpclass = fVar4;
        (pnVar17->m_backend).prec_elem = iVar5;
      }
    }
  }
  return n;
}

Assistant:

int CLUFactor<R>::vSolveUpdateRight(R* vec, int* ridx, int n, R eps)
{
   int i, j, k;
   int end;
   R x, y;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUnused;

   for(i = l.firstUpdate; i < end; ++i)
   {
      assert(i >= 0 && i < thedim);
      x = vec[lrow[i]];

      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            int m = ridx[n] = *idx++;
            assert(m >= 0 && m < thedim);
            y = vec[m];
            n += (y == 0) ? 1 : 0;
            y = y - x * (*val++);
            vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
         }
      }
   }

   return n;
}